

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_open_uri.cxx
# Opt level: O2

void fl_decode_uri(char *uri)

{
  int iVar1;
  undefined8 in_RAX;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uStack_38;
  int h;
  
  uStack_38 = in_RAX;
  sVar2 = strlen(uri);
  pcVar4 = uri + sVar2;
  lVar3 = -2 - (long)uri;
  do {
    if (pcVar4 + -2 <= uri) {
      return;
    }
    if (*uri == '%') {
      iVar1 = __isoc99_sscanf(uri + 1,"%2X",&h);
      if (iVar1 != 1) {
        return;
      }
      *uri = (char)h;
      memmove(uri + 1,uri + 3,(size_t)(pcVar4 + lVar3));
      pcVar4 = pcVar4 + -2;
    }
    uri = uri + 1;
    lVar3 = lVar3 + -1;
  } while( true );
}

Assistant:

void fl_decode_uri(char *uri)
{
  char *last = uri + strlen(uri);
  while (uri < last-2) {
    if (*uri == '%') {
      int h;
      if ( sscanf(uri+1, "%2X", &h) != 1 ) break;
      *uri = h;
      memmove(uri+1, uri+3, last - (uri+2));
      last -= 2;
    }
    uri++;
  }
}